

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cache.cpp
# Opt level: O0

void __thiscall
Cache::Cache(Cache *this,MemoryManager *manager,Policy policy,Cache *lowerCache,bool writeBack,
            bool writeAllocate)

{
  bool bVar1;
  byte in_CL;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined4 *in_RDI;
  byte in_R8B;
  undefined8 in_stack_00000008;
  undefined8 in_stack_00000010;
  undefined8 in_stack_00000018;
  Cache *this_00;
  
  this_00 = (Cache *)(in_RDI + 0x12);
  std::vector<Cache::Block,_std::allocator<Cache::Block>_>::vector
            ((vector<Cache::Block,_std::allocator<Cache::Block>_> *)0x108044);
  in_RDI[6] = 0;
  *(undefined8 *)(in_RDI + 8) = in_RSI;
  *(undefined8 *)(in_RDI + 0x10) = in_stack_00000018;
  *(undefined8 *)(in_RDI + 0xc) = in_stack_00000008;
  *(undefined8 *)(in_RDI + 0xe) = in_stack_00000010;
  *(undefined8 *)(in_RDI + 10) = in_RDX;
  bVar1 = isPolicyValid(this_00);
  if (!bVar1) {
    fprintf(_stderr,"Policy invalid!\n");
    exit(-1);
  }
  initCache(this);
  *in_RDI = 0;
  in_RDI[1] = 0;
  in_RDI[2] = 0;
  in_RDI[3] = 0;
  *(undefined8 *)(in_RDI + 4) = 0;
  *(byte *)(in_RDI + 7) = in_CL & 1;
  *(byte *)((long)in_RDI + 0x1d) = in_R8B & 1;
  return;
}

Assistant:

Cache::Cache(MemoryManager *manager, Policy policy, Cache *lowerCache,
             bool writeBack, bool writeAllocate) {
  this->referenceCounter = 0;
  this->memory = manager;
  this->policy = policy;
  this->lowerCache = lowerCache;
  if (!this->isPolicyValid()) {
    fprintf(stderr, "Policy invalid!\n");
    exit(-1);
  }
  this->initCache();
  this->statistics.numRead = 0;
  this->statistics.numWrite = 0;
  this->statistics.numHit = 0;
  this->statistics.numMiss = 0;
  this->statistics.totalCycles = 0;
  this->writeBack = writeBack;
  this->writeAllocate = writeAllocate;
}